

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestorderStatusRequestSetString::~TestorderStatusRequestSetString
          (TestorderStatusRequestSetString *this)

{
  TestorderStatusRequestSetString *this_local;
  
  ~TestorderStatusRequestSetString(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(orderStatusRequestSetString)
{
  OrderStatusRequest object;

  object.setString
    ( "8=FIX.4.2\0019=30\00135=H\00111=CLIENTID\00154=1\001"
      "55=MSFT\00110=141\001" );

  ClOrdID clOrdID;
  Symbol symbol;
  Side side;
  CHECK_EQUAL( "CLIENTID", object.get( clOrdID ) );
  CHECK_EQUAL( "MSFT", object.get( symbol ) );
  CHECK_EQUAL( '1', object.get( side ) );
}